

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 float32_to_floatx80_sparc64(float32 a,float_status *status)

{
  commonNaNT a_00;
  floatx80 fVar1;
  commonNaNT local_50;
  uint32_t local_34;
  int local_30;
  uint32_t aSig;
  int aExp;
  flag aSign;
  float_status *status_local;
  uint64_t uStack_18;
  float32 a_local;
  uint16_t local_10;
  
  _aExp = status;
  status_local._4_4_ = a;
  status_local._4_4_ = float32_squash_input_denormal_sparc64(a,status);
  local_34 = extractFloat32Frac(status_local._4_4_);
  local_30 = extractFloat32Exp(status_local._4_4_);
  aSig._3_1_ = extractFloat32Sign(status_local._4_4_);
  if (local_30 == 0xff) {
    if (local_34 == 0) {
      fVar1 = packFloatx80(aSig._3_1_,0x7fff,0x8000000000000000);
      local_10 = fVar1.high;
    }
    else {
      float32ToCommonNaN(&local_50,status_local._4_4_,_aExp);
      a_00.high = local_50.high;
      a_00.sign = local_50.sign;
      a_00._1_7_ = local_50._1_7_;
      a_00.low = local_50.low;
      fVar1 = commonNaNToFloatx80(a_00,_aExp);
      local_10 = fVar1.high;
    }
  }
  else {
    if (local_30 == 0) {
      if (local_34 == 0) {
        fVar1 = packFloatx80(aSig._3_1_,0,0);
        local_10 = fVar1.high;
        goto LAB_00e11228;
      }
      normalizeFloat32Subnormal(local_34,&local_30,&local_34);
    }
    local_34 = local_34 | 0x800000;
    fVar1 = packFloatx80(aSig._3_1_,local_30 + 0x3f80,(ulong)local_34 << 0x28);
    local_10 = fVar1.high;
  }
LAB_00e11228:
  uStack_18 = fVar1.low;
  fVar1.high = local_10;
  fVar1.low = uStack_18;
  return fVar1;
}

Assistant:

floatx80 float32_to_floatx80(float32 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint32_t aSig;

    a = float32_squash_input_denormal(a, status);
    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );
    if ( aExp == 0xFF ) {
        if (aSig) {
            return commonNaNToFloatx80(float32ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign,
                            floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    aSig |= 0x00800000;
    return packFloatx80( aSign, aExp + 0x3F80, ( (uint64_t) aSig )<<40 );

}